

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageMemoryAliasing.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sparse::anon_unknown_2::ImageSparseMemoryAliasingCase::createInstance
          (ImageSparseMemoryAliasingCase *this,Context *context)

{
  ImageSparseMemoryAliasingInstance *this_00;
  Context *context_local;
  ImageSparseMemoryAliasingCase *this_local;
  
  this_00 = (ImageSparseMemoryAliasingInstance *)operator_new(0x90);
  ImageSparseMemoryAliasingInstance::ImageSparseMemoryAliasingInstance
            (this_00,context,this->m_imageType,&this->m_imageSize,&this->m_format);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* ImageSparseMemoryAliasingCase::createInstance (Context& context) const
{
	return new ImageSparseMemoryAliasingInstance(context, m_imageType, m_imageSize, m_format);
}